

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  pointer piVar2;
  bool bVar3;
  Index IVar4;
  byte bVar5;
  Module *var;
  long lVar6;
  pointer piVar7;
  pointer this_00;
  long lVar8;
  
  SVar1 = this->kind;
  if (SVar1 == Declared) {
    bVar5 = 3;
  }
  else if (SVar1 == Passive) {
    bVar5 = 1;
  }
  else if (SVar1 == Active) {
    var = (Module *)&this->table_var;
    IVar4 = BindingHash::FindIndex(&module->table_bindings,(Var *)var);
    bVar5 = ((this->elem_type).enum_ != FuncRef || IVar4 != 0) * '\x02';
    module = var;
  }
  else {
    bVar5 = 0;
  }
  if ((this->elem_type).enum_ != FuncRef) goto LAB_00120e4a;
  this_00 = (this->elem_exprs).
            super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->elem_exprs).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)piVar2 - (long)this_00;
  for (lVar6 = lVar8 / 0x18 >> 2; piVar7 = this_00, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       this_00,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                )module);
    if (bVar3) goto LAB_00120e45;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       (this_00 + 1),
                       (__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                        )module);
    piVar7 = this_00 + 1;
    if (bVar3) goto LAB_00120e45;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       (this_00 + 2),
                       (__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                        )module);
    piVar7 = this_00 + 2;
    if (bVar3) goto LAB_00120e45;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       (this_00 + 3),
                       (__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                        )module);
    piVar7 = this_00 + 3;
    if (bVar3) goto LAB_00120e45;
    this_00 = this_00 + 4;
    lVar8 = lVar8 + -0x60;
  }
  lVar8 = lVar8 / 0x18;
  if (lVar8 == 1) {
LAB_00120e34:
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       this_00,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                )module);
    piVar7 = this_00;
    if (!bVar3) {
      piVar7 = piVar2;
    }
  }
  else if (lVar8 == 2) {
LAB_00120e24:
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       this_00,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                )module);
    piVar7 = this_00;
    if (!bVar3) {
      this_00 = this_00 + 1;
      goto LAB_00120e34;
    }
  }
  else {
    if (lVar8 != 3) {
      return bVar5;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::$_0>::operator()
                      ((_Iter_negate<wabt::ElemSegment::GetFlags(wabt::Module_const*)const::__0> *)
                       this_00,(__normal_iterator<const_wabt::intrusive_list<wabt::Expr>_*,_std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>_>
                                )module);
    if (!bVar3) {
      this_00 = this_00 + 1;
      goto LAB_00120e24;
    }
  }
LAB_00120e45:
  if (piVar7 == piVar2) {
    return bVar5;
  }
LAB_00120e4a:
  return bVar5 | 4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (elem_type != Type::FuncRef || table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  bool all_ref_func =
      elem_type == Type::FuncRef &&
      std::all_of(elem_exprs.begin(), elem_exprs.end(),
                  [](const ExprList& elem_expr) {
                    return elem_expr.front().type() == ExprType::RefFunc;
                  });

  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}